

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverterSharedData * createConverterFromFile(UConverterLoadArgs *pArgs,UErrorCode *err)

{
  UBool UVar1;
  UDataMemory *pData;
  UConverterSharedData *sharedData;
  UDataMemory *data;
  UErrorCode *err_local;
  UConverterLoadArgs *pArgs_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    pData = udata_openChoice_63(pArgs->pkg,"cnv",pArgs->name,isCnvAcceptable,(void *)0x0,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 == '\0') {
      pArgs_local = (UConverterLoadArgs *)ucnv_data_unFlattenClone(pArgs,pData,err);
      UVar1 = U_FAILURE(*err);
      if (UVar1 != '\0') {
        udata_close_63(pData);
        pArgs_local = (UConverterLoadArgs *)0x0;
      }
    }
    else {
      pArgs_local = (UConverterLoadArgs *)0x0;
    }
  }
  else {
    pArgs_local = (UConverterLoadArgs *)0x0;
  }
  return (UConverterSharedData *)pArgs_local;
}

Assistant:

static UConverterSharedData *createConverterFromFile(UConverterLoadArgs *pArgs, UErrorCode * err)
{
    UDataMemory *data;
    UConverterSharedData *sharedData;

    UTRACE_ENTRY_OC(UTRACE_UCNV_LOAD);

    if (U_FAILURE (*err)) {
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    UTRACE_DATA2(UTRACE_OPEN_CLOSE, "load converter %s from package %s", pArgs->name, pArgs->pkg);

    data = udata_openChoice(pArgs->pkg, DATA_TYPE, pArgs->name, isCnvAcceptable, NULL, err);
    if(U_FAILURE(*err))
    {
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    sharedData = ucnv_data_unFlattenClone(pArgs, data, err);
    if(U_FAILURE(*err))
    {
        udata_close(data);
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    /*
     * TODO Store pkg in a field in the shared data so that delta-only converters
     * can load base converters from the same package.
     * If the pkg name is longer than the field, then either do not load the converter
     * in the first place, or just set the pkg field to "".
     */

    UTRACE_EXIT_PTR_STATUS(sharedData, *err);
    return sharedData;
}